

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMutexTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleMutexTest_LockUnlockTest_TestShell::~TEST_SimpleMutexTest_LockUnlockTest_TestShell
          (TEST_SimpleMutexTest_LockUnlockTest_TestShell *this)

{
  TEST_SimpleMutexTest_LockUnlockTest_TestShell *this_local;
  
  ~TEST_SimpleMutexTest_LockUnlockTest_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleMutexTest, LockUnlockTest)
{
    {
        SimpleMutex mtx;
        mtx.Lock();
        mtx.Unlock();
    }

    CHECK_EQUAL(1, mutexCreateCount);
    CHECK_EQUAL(1, mutexLockCount);
    CHECK_EQUAL(1, mutexUnlockCount);
    CHECK_EQUAL(1, mutexDestroyCount);
}